

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.cpp
# Opt level: O0

Program * skiwi::make_program(Program *__return_storage_ptr__,
                             vector<skiwi::token,_std::allocator<skiwi::token>_> *tokens)

{
  bool bVar1;
  Expression local_110;
  undefined1 local_19;
  vector<skiwi::token,_std::allocator<skiwi::token>_> *local_18;
  vector<skiwi::token,_std::allocator<skiwi::token>_> *tokens_local;
  Program *prog;
  
  local_18 = tokens;
  tokens_local = (vector<skiwi::token,_std::allocator<skiwi::token>_> *)__return_storage_ptr__;
  anon_unknown_2::invalidate_popped();
  local_19 = 0;
  Program::Program(__return_storage_ptr__);
  while (bVar1 = std::vector<skiwi::token,_std::allocator<skiwi::token>_>::empty(local_18),
        ((bVar1 ^ 0xffU) & 1) != 0) {
    make_expression(&local_110,local_18);
    std::
    vector<std::variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>,_std::allocator<std::variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>_>_>
    ::push_back(&__return_storage_ptr__->expressions,&local_110);
    std::
    variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>
    ::~variant(&local_110);
  }
  return __return_storage_ptr__;
}

Assistant:

Program make_program(std::vector<token>& tokens)
  {
  invalidate_popped();
  Program prog;
  while (!tokens.empty())
    prog.expressions.push_back(make_expression(tokens));
  return prog;
  }